

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void __thiscall snestistics::LargeBitfield::read_file(LargeBitfield *this,BigFile *f)

{
  ulong uVar1;
  uint32_t *puVar2;
  LargeBitfield *__nbytes;
  uint local_1c;
  BigFile *pBStack_18;
  uint32_t new_size;
  BigFile *f_local;
  LargeBitfield *this_local;
  
  local_1c = 0;
  pBStack_18 = f;
  f_local = (BigFile *)this;
  BigFile::read<unsigned_int>(f,&local_1c);
  __nbytes = this;
  if (local_1c != this->_num_elements) {
    if (this->_state != (uint32_t *)0x0) {
      operator_delete__(this->_state);
    }
    uVar1 = SUB168(ZEXT416(local_1c) * ZEXT816(4),0);
    if (SUB168(ZEXT416(local_1c) * ZEXT816(4),8) != 0) {
      uVar1 = 0xffffffffffffffff;
    }
    puVar2 = (uint32_t *)operator_new__(uVar1);
    this->_state = puVar2;
    __nbytes = (LargeBitfield *)(ulong)local_1c;
    this->_num_elements = local_1c;
  }
  BigFile::read(pBStack_18,(int)this->_state,(void *)((ulong)local_1c << 2),(size_t)__nbytes);
  return;
}

Assistant:

void LargeBitfield::read_file(BigFile &f) {
	uint32_t new_size = 0;
	f.read(new_size);

	if (new_size != _num_elements) {
		delete[] _state;
		_state = new uint32_t[new_size];
		_num_elements = new_size;
	}

	f.read(_state, sizeof(uint32_t)*new_size);
}